

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_memory.c
# Opt level: O3

SUNMemoryHelper SUNMemoryHelper_Clone(SUNMemoryHelper helper)

{
  _func_SUNMemoryHelper_SUNMemoryHelper *UNRECOVERED_JUMPTABLE;
  SUNMemoryHelper_Ops pSVar1;
  SUNMemoryHelper_Ops pSVar2;
  _func_SUNErrCode_SUNMemoryHelper_SUNMemory_ptr_size_t_SUNMemoryType_void_ptr *p_Var3;
  _func_SUNErrCode_SUNMemoryHelper_SUNMemory_void_ptr *p_Var4;
  _func_SUNErrCode_SUNMemoryHelper_SUNMemory_SUNMemory_size_t_void_ptr *p_Var5;
  _func_SUNErrCode_SUNMemoryHelper_SUNMemory_SUNMemory_size_t_void_ptr *p_Var6;
  SUNMemoryHelper pSVar7;
  
  UNRECOVERED_JUMPTABLE = helper->ops->clone;
  if (UNRECOVERED_JUMPTABLE != (_func_SUNMemoryHelper_SUNMemoryHelper *)0x0) {
    pSVar7 = (*UNRECOVERED_JUMPTABLE)(helper);
    return pSVar7;
  }
  if ((helper->content == (void *)0x0) &&
     (pSVar7 = SUNMemoryHelper_NewEmpty(helper->sunctx), pSVar7 != (SUNMemoryHelper)0x0)) {
    pSVar1 = pSVar7->ops;
    pSVar2 = helper->ops;
    pSVar1->destroy = pSVar2->destroy;
    p_Var3 = pSVar2->alloc;
    p_Var4 = pSVar2->dealloc;
    p_Var5 = pSVar2->copy;
    p_Var6 = pSVar2->copyasync;
    UNRECOVERED_JUMPTABLE = pSVar2->clone;
    pSVar1->getallocstats = pSVar2->getallocstats;
    pSVar1->clone = UNRECOVERED_JUMPTABLE;
    pSVar1->copy = p_Var5;
    pSVar1->copyasync = p_Var6;
    pSVar1->alloc = p_Var3;
    pSVar1->dealloc = p_Var4;
    return pSVar7;
  }
  return (SUNMemoryHelper)0x0;
}

Assistant:

SUNMemoryHelper SUNMemoryHelper_Clone(SUNMemoryHelper helper)
{
  SUNFunctionBegin(helper->sunctx);
  if (!helper->ops->clone)
  {
    if (helper->content)
    {
      SUNAssertNull(helper->ops->clone, SUN_ERR_NOT_IMPLEMENTED);
      return (NULL);
    }
    else
    {
      SUNMemoryHelper hclone = SUNMemoryHelper_NewEmpty(helper->sunctx);
      if (hclone) { SUNMemoryHelper_CopyOps(helper, hclone); }
      return (hclone);
    }
  }
  else { return (helper->ops->clone(helper)); }
}